

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int u32_to_u8(uint32_t *in,int in_len,uint8_t *out,int order)

{
  uint uVar1;
  uint32_t ret_;
  int i_1;
  int i;
  int order_local;
  uint8_t *out_local;
  int in_len_local;
  uint32_t *in_local;
  int local_4;
  
  if ((in == (uint32_t *)0x0) || (out == (uint8_t *)0x0)) {
    local_4 = 0;
  }
  else {
    out_local = out;
    if (order == 1) {
      for (i = 0; i < in_len; i = i + 1) {
        *(uint32_t *)out_local = in[i];
        out_local = out_local + 4;
      }
    }
    else {
      for (i_1 = 0; i_1 < in_len; i_1 = i_1 + 1) {
        uVar1 = in[i_1];
        *(uint *)out_local =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        out_local = out_local + 4;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int u32_to_u8(const uint32_t *in, int in_len, uint8_t *out, int order)
{
    if (in == NULL || out == NULL)
        return GML_ERROR;

    if (order == ENDIANESS) {
        for (int i = 0; i < in_len; i++) {
            *(uint32_t*)out = in[i];
            out += 4;
        }
    }
    else {
        for (int i = 0; i < in_len; i++) {
            *(uint32_t*)out = BSWAP4(in[i]);
            out += 4;
        }
    }

    return GML_OK;
}